

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

RealType __thiscall OpenMD::Snapshot::getXYarea(Snapshot *this)

{
  RealType RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint i;
  Mat3x3d *pMVar7;
  double *pdVar8;
  uint j;
  long lVar9;
  double tmp;
  double dVar10;
  Vector<double,_3U> v;
  double local_28 [4];
  
  if (this->hasXYarea == true) {
    RVar1 = (this->frameData).xyArea;
  }
  else {
    pMVar7 = &(this->frameData).hmat;
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    lVar9 = 0;
    do {
      local_28[lVar9] =
           (pMVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
      dVar6 = local_28[2];
      dVar5 = local_28[1];
      dVar3 = local_28[0];
      lVar9 = lVar9 + 1;
      pMVar7 = (Mat3x3d *)
               ((pMVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar9 != 3);
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    pdVar8 = (this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
             data_[0] + 1;
    lVar9 = 0;
    do {
      local_28[lVar9] = *pdVar8;
      dVar4 = local_28[0];
      lVar9 = lVar9 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar9 != 3);
    dVar2 = dVar3 * local_28[1];
    dVar10 = local_28[0] * dVar6;
    local_28[0] = local_28[2] * dVar5 - dVar6 * local_28[1];
    local_28[1] = dVar10 - dVar3 * local_28[2];
    local_28[2] = dVar2 - dVar4 * dVar5;
    dVar3 = 0.0;
    lVar9 = 0;
    do {
      dVar3 = dVar3 + local_28[lVar9] * local_28[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    if (dVar3 < 0.0) {
      RVar1 = sqrt(dVar3);
    }
    else {
      RVar1 = SQRT(dVar3);
    }
    (this->frameData).xyArea = RVar1;
    this->hasXYarea = true;
  }
  return RVar1;
}

Assistant:

RealType Snapshot::getXYarea() {
    if (!hasXYarea) {
      Vector3d x       = frameData.hmat.getColumn(0);
      Vector3d y       = frameData.hmat.getColumn(1);
      frameData.xyArea = cross(x, y).length();
      hasXYarea        = true;
    }
    return frameData.xyArea;
  }